

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_shuffle_8bytes(char *heap,LONGLONG length,int *status)

{
  long lVar1;
  int extraout_EAX;
  void *__src;
  long lVar2;
  long lVar3;
  
  __src = calloc(1,length * 8);
  lVar2 = 0;
  lVar3 = 0;
  if (0 < length) {
    lVar3 = length;
  }
  for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    *(char *)((long)__src + lVar2) = heap[lVar2 * 8];
    *(char *)((long)__src + length + lVar2) = heap[lVar2 * 8 + 1];
    *(char *)((long)__src + length + length + lVar2) = heap[lVar2 * 8 + 2];
    lVar1 = length + length + lVar2;
    *(char *)((long)__src + length + lVar1) = heap[lVar2 * 8 + 3];
    lVar1 = length + lVar1;
    *(char *)((long)__src + length + lVar1) = heap[lVar2 * 8 + 4];
    lVar1 = length + lVar1;
    *(char *)((long)__src + length + lVar1) = heap[lVar2 * 8 + 5];
    lVar1 = length + lVar1;
    *(char *)((long)__src + length + lVar1) = heap[lVar2 * 8 + 6];
    *(char *)((long)__src + length * 2 + lVar1) = heap[lVar2 * 8 + 7];
  }
  memcpy(heap,__src,length * 8);
  free(__src);
  return extraout_EAX;
}

Assistant:

static int fits_shuffle_8bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 8-byte integers or doubles in the heap */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = calloc(1, (size_t) (length * 8));
    heapptr = heap;
    
/* for some bizarre reason this loop fails to compile under OpenSolaris using
   the proprietary SunStudioExpress C compiler;  use the following equivalent
   loop instead.
   
    cptr = ptr;

    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       *(cptr + (length * 2)) = *heapptr;
       heapptr++;
       *(cptr + (length * 3)) = *heapptr;
       heapptr++;
       *(cptr + (length * 4)) = *heapptr;
       heapptr++;
       *(cptr + (length * 5)) = *heapptr;
       heapptr++;
       *(cptr + (length * 6)) = *heapptr;
       heapptr++;
       *(cptr + (length * 7)) = *heapptr;
       heapptr++;
       cptr++;
     }
*/
     for (ii = 0; ii < length; ii++) {
        cptr = ptr + ii;

        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
     }
        
    memcpy(heap, ptr, (size_t) (length * 8));
    free(ptr);
 
    return(*status);
}